

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

void __thiscall MinVR::element::~element(element *this)

{
  list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  element *peVar5;
  attribute *this_00;
  _List_node_base *p_Var6;
  element *peVar7;
  
  if (this->name_is_allocated == true) {
    free(this->m_name);
  }
  if (this->is_empty_attribute_list == false) {
    peVar7 = (element *)
             (this->m_attribute_list).
             super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while ((this->it)._M_node = (_List_node_base *)peVar7, peVar7 != this) {
      this_00 = (attribute *)
                (peVar7->m_attribute_list).
                super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
                _M_node._M_size;
      if (this_00 != (attribute *)0x0) {
        attribute::~attribute(this_00);
        operator_delete(this_00,0x18);
      }
      peVar7 = (element *)((this->it)._M_node)->_M_next;
    }
  }
  plVar1 = &this->m_element_list;
  p_Var6 = (this->m_element_list).
           super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while ((this->i)._M_node = p_Var6, p_Var6 != (_List_node_base *)plVar1) {
    peVar7 = (element *)p_Var6[1]._M_next;
    if (peVar7 != (element *)0x0) {
      ~element(peVar7);
      operator_delete(peVar7,0xb0);
    }
    p_Var6 = ((this->i)._M_node)->_M_next;
  }
  pcVar3 = (this->m_value)._M_dataplus._M_p;
  paVar2 = &(this->m_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  p_Var6 = (this->m_comment_list).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var6 != (_List_node_base *)&this->m_comment_list) {
    p_Var4 = p_Var6->_M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var4;
  }
  p_Var6 = (plVar1->super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var6 != (_List_node_base *)plVar1) {
    p_Var4 = p_Var6->_M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var4;
  }
  peVar7 = (element *)
           (this->m_attribute_list).
           super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while (peVar7 != this) {
    peVar5 = (element *)
             (peVar7->m_attribute_list).
             super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    operator_delete(peVar7,0x18);
    peVar7 = peVar5;
  }
  return;
}

Assistant:

element::~element()
{
    //if(value_is_allocated)
        //free(m_value);
    if(name_is_allocated)
        free(m_name);
    if(is_empty_attribute_list == false)
    {
        it = m_attribute_list.begin();
        while(it != m_attribute_list.end())
        {
            delete(*it);
            it++;
        }
    }
    i = m_element_list.begin();
    while(i != m_element_list.end())
    {
        delete(*i);
        i++;
    }
}